

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int CloseFiles(Context *context,int success)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  int local_18;
  int is_ok;
  int success_local;
  Context *context_local;
  
  local_18 = 1;
  if ((context->test_integrity == 0) && (context->fout != (FILE *)0x0)) {
    if ((success == 0) && (context->current_output_path != (char *)0x0)) {
      unlink(context->current_output_path);
    }
    iVar2 = fclose((FILE *)context->fout);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      if (success != 0) {
        pcVar3 = PrintablePath(context->current_output_path);
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"fclose failed [%s]: %s\n",pcVar3,pcVar5);
      }
      local_18 = 0;
    }
    if (((success != 0) && (local_18 != 0)) && (context->copy_stat != 0)) {
      CopyStat(context->current_input_path,context->current_output_path);
    }
  }
  if ((context->fin != (FILE *)0x0) &&
     (iVar2 = fclose((FILE *)context->fin), pFVar1 = _stderr, iVar2 != 0)) {
    if (local_18 != 0) {
      pcVar3 = PrintablePath(context->current_input_path);
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"fclose failed [%s]: %s\n",pcVar3,pcVar5);
    }
    local_18 = 0;
  }
  if (((success != 0) && (context->junk_source != 0)) &&
     (context->current_input_path != (char *)0x0)) {
    unlink(context->current_input_path);
  }
  context->fin = (FILE *)0x0;
  context->fout = (FILE *)0x0;
  return local_18;
}

Assistant:

static BROTLI_BOOL CloseFiles(Context* context, BROTLI_BOOL success) {
  BROTLI_BOOL is_ok = BROTLI_TRUE;
  if (!context->test_integrity && context->fout) {
    if (!success && context->current_output_path) {
      unlink(context->current_output_path);
    }
    if (fclose(context->fout) != 0) {
      if (success) {
        fprintf(stderr, "fclose failed [%s]: %s\n",
                PrintablePath(context->current_output_path), strerror(errno));
      }
      is_ok = BROTLI_FALSE;
    }

    /* TOCTOU violation, but otherwise it is impossible to set file times. */
    if (success && is_ok && context->copy_stat) {
      CopyStat(context->current_input_path, context->current_output_path);
    }
  }

  if (context->fin) {
    if (fclose(context->fin) != 0) {
      if (is_ok) {
        fprintf(stderr, "fclose failed [%s]: %s\n",
                PrintablePath(context->current_input_path), strerror(errno));
      }
      is_ok = BROTLI_FALSE;
    }
  }
  if (success && context->junk_source && context->current_input_path) {
    unlink(context->current_input_path);
  }

  context->fin = NULL;
  context->fout = NULL;

  return is_ok;
}